

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.h
# Opt level: O0

wav_basis_norms_static<16> * idx2::GetCdf53NormsFast<16>(void)

{
  wav_basis_norms_static<16> *in_RDI;
  double dVar1;
  int local_3c;
  double dStack_38;
  int I;
  f64 Num2;
  f64 Num1;
  
  wav_basis_norms_static<16>::wav_basis_norms_static(in_RDI);
  Num2 = 3.0;
  dStack_38 = 23.0;
  local_3c = 0;
  while( true ) {
    if (0xf < local_3c) {
      return in_RDI;
    }
    dVar1 = sqrt((double)Num2 / (double)(1 << ((char)local_3c + 1U & 0x1f)));
    if (0xf < local_3c) break;
    (in_RDI->ScalNorms).Arr[local_3c] = dVar1;
    Num2 = (f64)((double)Num2 * 4.0 + -1.0);
    dVar1 = sqrt(dStack_38 / (double)(1 << ((char)local_3c + 5U & 0x1f)));
    if (0xf < local_3c) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]");
    }
    (in_RDI->WaveNorms).Arr[local_3c] = dVar1;
    dStack_38 = dStack_38 * 4.0 + -33.0;
    local_3c = local_3c + 1;
  }
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x20c,
                "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]");
}

Assistant:

wav_basis_norms_static<N>
GetCdf53NormsFast()
{
  wav_basis_norms_static<N> Result;
  f64 Num1 = 3, Num2 = 23;
  for (int I = 0; I < N; ++I)
  {
    Result.ScalNorms[I] = sqrt(Num1 / (1 << (I + 1)));
    Num1 = Num1 * 4 - 1;
    Result.WaveNorms[I] = sqrt(Num2 / (1 << (I + 5)));
    Num2 = Num2 * 4 - 33;
  }
  return Result;
}